

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall wasm::WasmBinaryWriter::writeLegacyDylinkSection(WasmBinaryWriter *this)

{
  DylinkSection *pDVar1;
  string_view *psVar2;
  undefined *puVar3;
  int32_t start;
  size_t sVar4;
  Name *neededDynlib;
  string_view *psVar5;
  string_view name;
  
  if ((this->wasm->dylinkSection)._M_t.
      super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>._M_t.
      super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>.
      super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl != (DylinkSection *)0x0) {
    start = startSection<wasm::BinaryConsts::Section>(this,Custom);
    puVar3 = BinaryConsts::CustomSections::Dylink;
    sVar4 = strlen(BinaryConsts::CustomSections::Dylink);
    name._M_str = puVar3;
    name._M_len = sVar4;
    writeInlineString(this,name);
    BufferWithRandomAccess::operator<<
              (this->o,(U32LEB)((this->wasm->dylinkSection)._M_t.
                                super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>
                                .super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl)->
                               memorySize);
    BufferWithRandomAccess::operator<<
              (this->o,(U32LEB)((this->wasm->dylinkSection)._M_t.
                                super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>
                                .super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl)->
                               memoryAlignment);
    BufferWithRandomAccess::operator<<
              (this->o,(U32LEB)((this->wasm->dylinkSection)._M_t.
                                super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>
                                .super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl)->
                               tableSize);
    BufferWithRandomAccess::operator<<
              (this->o,(U32LEB)((this->wasm->dylinkSection)._M_t.
                                super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>
                                .super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl)->
                               tableAlignment);
    pDVar1 = (this->wasm->dylinkSection)._M_t.
             super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>.
             _M_t.
             super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>
             .super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl;
    BufferWithRandomAccess::operator<<
              (this->o,(U32LEB)(uint)((ulong)((long)*(pointer *)
                                                     ((long)&(pDVar1->neededDynlibs).
                                                                                                                          
                                                  super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>
                                                  + 8) -
                                             *(long *)&(pDVar1->neededDynlibs).
                                                                                                              
                                                  super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>
                                                  ._M_impl) >> 4));
    pDVar1 = (this->wasm->dylinkSection)._M_t.
             super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>.
             _M_t.
             super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>
             .super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl;
    psVar2 = *(string_view **)
              ((long)&(pDVar1->neededDynlibs).
                      super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_> + 8);
    for (psVar5 = *(string_view **)
                   &(pDVar1->neededDynlibs).
                    super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl;
        psVar5 != psVar2; psVar5 = psVar5 + 1) {
      writeInlineString(this,*psVar5);
    }
    finishSection(this,start);
    return;
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeLegacyDylinkSection() {
  if (!wasm->dylinkSection) {
    return;
  }

  auto start = startSection(BinaryConsts::Custom);
  writeInlineString(BinaryConsts::CustomSections::Dylink);
  o << U32LEB(wasm->dylinkSection->memorySize);
  o << U32LEB(wasm->dylinkSection->memoryAlignment);
  o << U32LEB(wasm->dylinkSection->tableSize);
  o << U32LEB(wasm->dylinkSection->tableAlignment);
  o << U32LEB(wasm->dylinkSection->neededDynlibs.size());
  for (auto& neededDynlib : wasm->dylinkSection->neededDynlibs) {
    writeInlineString(neededDynlib.str);
  }
  finishSection(start);
}